

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_enc.c
# Opt level: O3

int WebPWriteBMP(FILE *fout,WebPDecBuffer *buffer)

{
  int iVar1;
  size_t sVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint8_t *__ptr;
  uint8_t zeroes [3];
  undefined2 local_80;
  undefined1 local_7e;
  uint local_7c;
  ulong local_78;
  long local_70;
  undefined2 local_68;
  undefined1 local_66;
  undefined1 local_65;
  undefined1 local_64;
  undefined1 local_63;
  undefined4 local_62;
  undefined8 local_5e;
  undefined1 local_56;
  undefined1 local_55;
  undefined1 local_54;
  undefined1 local_53;
  undefined1 local_52;
  undefined1 local_51;
  undefined1 local_50;
  undefined1 local_4f;
  undefined2 local_4e;
  char local_4c;
  undefined8 local_4b;
  undefined1 local_43;
  undefined4 local_42;
  undefined2 local_3e;
  undefined8 local_3c;
  undefined2 local_34;
  
  uVar6 = buffer->colorspace - MODE_RGBA;
  if ((0xb < uVar6) || (iVar1 = 4, (0x81dU >> (uVar6 & 0x1f) & 1) == 0)) {
    iVar1 = 4 - (uint)(buffer->colorspace - MODE_YUV < 0xfffffffc);
  }
  __ptr = (buffer->u).RGBA.rgba;
  iVar3 = 0;
  if (__ptr != (uint8_t *)0x0 && fout != (FILE *)0x0) {
    iVar3 = buffer->width;
    iVar5 = buffer->height;
    local_70 = (long)(buffer->u).RGBA.stride;
    uVar6 = iVar3 * iVar1;
    local_7c = uVar6 + 3 & 0xfffffffc;
    iVar4 = local_7c * iVar5 + 0x36;
    local_68 = 0x4d42;
    local_66 = (undefined1)iVar4;
    local_65 = (undefined1)((uint)iVar4 >> 8);
    local_64 = (undefined1)((uint)iVar4 >> 0x10);
    local_63 = (undefined1)((uint)iVar4 >> 0x18);
    local_62 = 0;
    local_5e = 0x2800000036;
    local_56 = (undefined1)iVar3;
    local_55 = (undefined1)((uint)iVar3 >> 8);
    local_54 = (undefined1)((uint)iVar3 >> 0x10);
    local_53 = (undefined1)((uint)iVar3 >> 0x18);
    iVar3 = -iVar5;
    local_52 = (undefined1)iVar3;
    local_51 = (undefined1)((uint)iVar3 >> 8);
    local_50 = (undefined1)((uint)iVar3 >> 0x10);
    local_4f = (undefined1)((uint)iVar3 >> 0x18);
    local_4e = 1;
    local_4c = (char)iVar1 << 3;
    iVar3 = 0;
    local_4b = 0;
    local_43 = 0;
    local_42 = 0x960;
    local_3e = 0x960;
    local_3c = 0;
    local_34 = 0;
    sVar2 = fwrite(&local_68,0x36,1,(FILE *)fout);
    if (sVar2 == 1) {
      if (iVar5 != 0) {
        local_78 = (ulong)(local_7c - uVar6);
        do {
          sVar2 = fwrite(__ptr,(ulong)uVar6,1,(FILE *)fout);
          if (sVar2 != 1) {
            return 0;
          }
          if (local_7c != uVar6) {
            local_7e = 0;
            local_80 = 0;
            sVar2 = fwrite(&local_80,local_78,1,(FILE *)fout);
            if (sVar2 != 1) {
              return 0;
            }
          }
          __ptr = __ptr + local_70;
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
      }
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

int WebPWriteBMP(FILE* fout, const WebPDecBuffer* const buffer) {
  const int has_alpha = WebPIsAlphaMode(buffer->colorspace);
  const uint32_t width = buffer->width;
  const uint32_t height = buffer->height;
  const uint8_t* rgba = buffer->u.RGBA.rgba;
  const int stride = buffer->u.RGBA.stride;
  const uint32_t bytes_per_px = has_alpha ? 4 : 3;
  uint32_t y;
  const uint32_t line_size = bytes_per_px * width;
  const uint32_t bmp_stride = (line_size + 3) & ~3;   // pad to 4
  const uint32_t total_size = bmp_stride * height + BMP_HEADER_SIZE;
  uint8_t bmp_header[BMP_HEADER_SIZE] = { 0 };

  if (fout == NULL || buffer == NULL || rgba == NULL) return 0;

  // bitmap file header
  PutLE16(bmp_header + 0, 0x4d42);                // signature 'BM'
  PutLE32(bmp_header + 2, total_size);            // size including header
  PutLE32(bmp_header + 6, 0);                     // reserved
  PutLE32(bmp_header + 10, BMP_HEADER_SIZE);      // offset to pixel array
  // bitmap info header
  PutLE32(bmp_header + 14, 40);                   // DIB header size
  PutLE32(bmp_header + 18, width);                // dimensions
  PutLE32(bmp_header + 22, -(int)height);         // vertical flip!
  PutLE16(bmp_header + 26, 1);                    // number of planes
  PutLE16(bmp_header + 28, bytes_per_px * 8);     // bits per pixel
  PutLE32(bmp_header + 30, 0);                    // no compression (BI_RGB)
  PutLE32(bmp_header + 34, 0);                    // image size (placeholder)
  PutLE32(bmp_header + 38, 2400);                 // x pixels/meter
  PutLE32(bmp_header + 42, 2400);                 // y pixels/meter
  PutLE32(bmp_header + 46, 0);                    // number of palette colors
  PutLE32(bmp_header + 50, 0);                    // important color count

  // TODO(skal): color profile

  // write header
  if (fwrite(bmp_header, sizeof(bmp_header), 1, fout) != 1) {
    return 0;
  }

  // write pixel array
  for (y = 0; y < height; ++y) {
    if (fwrite(rgba, line_size, 1, fout) != 1) {
      return 0;
    }
    // write padding zeroes
    if (bmp_stride != line_size) {
      const uint8_t zeroes[3] = { 0 };
      if (fwrite(zeroes, bmp_stride - line_size, 1, fout) != 1) {
        return 0;
      }
    }
    rgba += stride;
  }
  return 1;
}